

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS
ref_facelift_gradation_at_complexity
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL gradation,REF_DBL complexity)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  uint uVar4;
  REF_DBL *pRVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  REF_DBL RVar10;
  REF_DBL current_complexity;
  double local_60;
  REF_DBL local_58;
  REF_DBL local_48;
  
  pRVar2 = ref_grid->node;
  local_48 = gradation;
  if (gradation <= -gradation) {
    local_48 = -gradation;
  }
  iVar8 = 0;
  local_58 = gradation;
  while( true ) {
    uVar4 = ref_facelift_complexity(metric,ref_grid,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x555,"ref_facelift_gradation_at_complexity",(ulong)uVar4,"cmp");
      return uVar4;
    }
    dVar9 = local_60 * 1e+20;
    if (dVar9 <= -dVar9) {
      dVar9 = -dVar9;
    }
    if (dVar9 <= local_48) break;
    iVar1 = pRVar2->max;
    if (0 < (long)iVar1) {
      pRVar3 = pRVar2->global;
      lVar6 = 0;
      pRVar5 = metric;
      do {
        if (-1 < pRVar3[lVar6]) {
          lVar7 = 0;
          do {
            pRVar5[lVar7] = pRVar5[lVar7] * (local_58 / local_60);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 6);
        }
        lVar6 = lVar6 + 1;
        pRVar5 = pRVar5 + 6;
      } while (lVar6 != iVar1);
    }
    uVar4 = ref_metric_mixed_space_gradation(metric,ref_grid,-1.0,-1.0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x561,"ref_facelift_gradation_at_complexity",(ulong)uVar4,"gradation");
      return uVar4;
    }
    iVar8 = iVar8 + 1;
    if (iVar8 == 0x14) {
      uVar4 = ref_facelift_complexity(metric,ref_grid,&local_60);
      if (uVar4 == 0) {
        dVar9 = local_60 * 1e+20;
        if (dVar9 <= -dVar9) {
          dVar9 = -dVar9;
        }
        RVar10 = local_58;
        if (local_58 <= -local_58) {
          RVar10 = -local_58;
        }
        uVar4 = 4;
        if (RVar10 < dVar9) {
          iVar8 = pRVar2->max;
          if ((long)iVar8 < 1) {
            uVar4 = 0;
          }
          else {
            pRVar3 = pRVar2->global;
            lVar6 = 0;
            uVar4 = 0;
            do {
              if (-1 < pRVar3[lVar6]) {
                lVar7 = 0;
                do {
                  metric[lVar7] = metric[lVar7] * (local_58 / local_60);
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 6);
              }
              lVar6 = lVar6 + 1;
              metric = metric + 6;
            } while (lVar6 != iVar8);
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x567,"ref_facelift_gradation_at_complexity",(ulong)uVar4,"cmp");
      }
      return uVar4;
    }
  }
  return 4;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_gradation_at_complexity(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL gradation, REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT relaxations;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;
  REF_INT node, i;

  complexity_scale = 1.0; /* "2D" along surf */

  for (relaxations = 0; relaxations < 20; relaxations++) {
    RSS(ref_facelift_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(complexity, current_complexity)) {
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] *=
            pow(complexity / current_complexity, complexity_scale);
      }
    }
    if (gradation < 1.0) {
      RSS(ref_metric_mixed_space_gradation(metric, ref_grid, -1.0, -1.0),
          "gradation");
    } else {
      RSS(ref_metric_metric_space_gradation(metric, ref_grid, gradation),
          "gradation");
    }
  }
  RSS(ref_facelift_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(complexity / current_complexity, complexity_scale);
    }
  }

  return REF_SUCCESS;
}